

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O3

opj_sparse_array_int32_t *
opj_sparse_array_int32_create
          (OPJ_UINT32 width,OPJ_UINT32 height,OPJ_UINT32 block_width,OPJ_UINT32 block_height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  opj_sparse_array_int32_t *ptr;
  ulong uVar5;
  ulong uVar6;
  OPJ_INT32 **ppOVar7;
  
  if ((block_height != 0 && block_width != 0) && (height != 0 && width != 0)) {
    if ((uint)(0xffffffff / (ulong)block_height >> 2) < block_width) {
      return (opj_sparse_array_int32_t *)0x0;
    }
    ptr = (opj_sparse_array_int32_t *)opj_calloc(1,0x20);
    ptr->width = width;
    ptr->height = height;
    ptr->block_width = block_width;
    ptr->block_height = block_height;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = CONCAT44(0,block_width);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = ((ulong)width + CONCAT44(0,block_width)) - 1;
    uVar5 = SUB168(auVar3 / auVar1,0);
    ptr->block_count_hor = SUB164(auVar3 / auVar1,0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = CONCAT44(0,block_height);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = ((ulong)height + CONCAT44(0,block_height)) - 1;
    uVar6 = SUB168(auVar4 / auVar2,0);
    ptr->block_count_ver = SUB164(auVar4 / auVar2,0);
    if ((int)((uVar6 & 0xffffffff) * (uVar5 & 0xffffffff) >> 0x20) == 0) {
      ppOVar7 = (OPJ_INT32 **)opj_calloc(8,(uVar6 & 0xffffffff) * (uVar5 & 0xffffffff));
      ptr->data_blocks = ppOVar7;
      if (ppOVar7 != (OPJ_INT32 **)0x0) {
        return ptr;
      }
    }
    opj_free(ptr);
  }
  return (opj_sparse_array_int32_t *)0x0;
}

Assistant:

opj_sparse_array_int32_t* opj_sparse_array_int32_create(OPJ_UINT32 width,
        OPJ_UINT32 height,
        OPJ_UINT32 block_width,
        OPJ_UINT32 block_height)
{
    opj_sparse_array_int32_t* sa;

    if (width == 0 || height == 0 || block_width == 0 || block_height == 0) {
        return NULL;
    }
    if (block_width > ((OPJ_UINT32)~0U) / block_height / sizeof(OPJ_INT32)) {
        return NULL;
    }

    sa = (opj_sparse_array_int32_t*) opj_calloc(1,
            sizeof(opj_sparse_array_int32_t));
    sa->width = width;
    sa->height = height;
    sa->block_width = block_width;
    sa->block_height = block_height;
    sa->block_count_hor = opj_uint_ceildiv(width, block_width);
    sa->block_count_ver = opj_uint_ceildiv(height, block_height);
    if (sa->block_count_hor > ((OPJ_UINT32)~0U) / sa->block_count_ver) {
        opj_free(sa);
        return NULL;
    }
    sa->data_blocks = (OPJ_INT32**) opj_calloc(sizeof(OPJ_INT32*),
                      (size_t) sa->block_count_hor * sa->block_count_ver);
    if (sa->data_blocks == NULL) {
        opj_free(sa);
        return NULL;
    }

    return sa;
}